

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueue.h
# Opt level: O2

void __thiscall
rigtorp::SPSCQueue<TestType,_std::allocator<TestType>_>::~SPSCQueue
          (SPSCQueue<TestType,_std::allocator<TestType>_> *this)

{
  TestType *pTVar1;
  
  while( true ) {
    pTVar1 = front(this);
    if (pTVar1 == (TestType *)0x0) break;
    pop(this);
  }
  operator_delete(this->slots_,this->capacity_ + 0x80);
  return;
}

Assistant:

~SPSCQueue() {
    while (front()) {
      pop();
    }
    std::allocator_traits<Allocator>::deallocate(allocator_, slots_,
                                                 capacity_ + 2 * kPadding);
  }